

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<void_()>_>::~list_elem
          (list_elem<trompeloeil::call_matcher_base<void_()>_> *this)

{
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar2;
  
  this->_vptr_list_elem = (_func_int **)&PTR__list_elem_0018ad50;
  invariant_check(this);
  plVar1 = this->next;
  plVar2 = this->prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  this->next = this;
  this->prev = this;
  invariant_check(this);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }